

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.h
# Opt level: O1

void __thiscall Clasp::Antecedent::reason(Antecedent *this,Solver *s,Literal p,LitVec *lits)

{
  long *plVar1;
  Literal local_20;
  Literal local_1c;
  
  plVar1 = (long *)this->data_;
  if (((ulong)plVar1 & 3) != 0) {
    local_1c.rep_ = (uint)((ulong)plVar1 >> 0x20) & 0xfffffffe;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(lits,&local_1c);
    if (((uint)plVar1 & 3) == 1) {
      local_20.rep_ = (uint)(this->data_ >> 1) & 0xfffffffe;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(lits,&local_20)
      ;
    }
    return;
  }
  (**(code **)(*plVar1 + 8))();
  return;
}

Assistant:

void reason(Solver& s, Literal p, LitVec& lits) const {
		assert(!isNull());
		Type t = type();
		if (t == Generic) {
			constraint()->reason(s, p, lits);
			return;
		}
		lits.push_back(firstLiteral());
		if (t == Ternary) { lits.push_back(secondLiteral()); }
	}